

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

FilePath __thiscall testing::internal::FilePath::RemoveExtension(FilePath *this,char *extension)

{
  undefined1 uVar1;
  char *buffer;
  undefined8 in_RDX;
  size_t extraout_RDX;
  String *in_RSI;
  String *in_RDI;
  FilePath FVar2;
  String dot_extension;
  FilePath *in_stack_ffffffffffffff68;
  String *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  String *this_00;
  String local_28 [2];
  
  this_00 = in_RDI;
  String::Format((char *)local_28,".%s",in_RDX);
  String::c_str(local_28);
  uVar1 = String::EndsWithCaseInsensitive(this_00,(char *)in_RDI);
  if ((bool)uVar1) {
    in_stack_ffffffffffffff70 = (String *)String::c_str(in_RSI);
    buffer = (char *)String::length(in_RSI);
    String::String(in_stack_ffffffffffffff70,buffer,0x1f8f29);
    FilePath((FilePath *)in_RDI,(String *)CONCAT17(uVar1,in_stack_ffffffffffffff78));
    String::~String(in_stack_ffffffffffffff70);
  }
  else {
    FilePath((FilePath *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  String::~String(in_stack_ffffffffffffff70);
  FVar2.pathname_.length_ = extraout_RDX;
  FVar2.pathname_.c_str_ = (char *)this_00;
  return (FilePath)FVar2.pathname_;
}

Assistant:

FilePath FilePath::RemoveExtension(const char* extension) const {
  String dot_extension(String::Format(".%s", extension));
  if (pathname_.EndsWithCaseInsensitive(dot_extension.c_str())) {
    return FilePath(String(pathname_.c_str(), pathname_.length() - 4));
  }
  return *this;
}